

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O2

void __thiscall xray_re::xr_skl_motion::save(xr_skl_motion *this,xr_writer *w)

{
  pointer ppxVar1;
  pointer ppxVar2;
  f_w_const<xray_re::xr_bone_motion> write;
  f_w_const<xray_re::xr_motion_marks> write_00;
  uint uVar3;
  ulong uVar4;
  undefined1 in_stack_ffffffffffffffc8 [12];
  undefined1 uVar5;
  undefined1 uVar6;
  undefined2 uVar7;
  
  xr_motion::save(&this->super_xr_motion,w);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffd4,2);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffd4,1);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffd4,2);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffd4,4);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffd4,4);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffd4,4);
  uVar7 = (undefined2)((uint)this->m_power >> 0x10);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffd4,4);
  uVar3 = (uint)(*(int *)&(this->m_bone_motions).
                          super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                *(int *)&(this->m_bone_motions).
                         super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar5 = (undefined1)uVar3;
  uVar6 = (undefined1)(uVar3 >> 8);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffd4,2);
  write._12_1_ = uVar5;
  write._0_12_ = in_stack_ffffffffffffffc8;
  write._13_1_ = uVar6;
  write._14_2_ = uVar7;
  xr_writer::
  w_seq<std::vector<xray_re::xr_bone_motion*,std::allocator<xray_re::xr_bone_motion*>>,xray_re::xr_writer::f_w_const<xray_re::xr_bone_motion>>
            (w,&this->m_bone_motions,write);
  ppxVar1 = (this->m_marks).
            super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppxVar2 = (this->m_marks).
            super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppxVar1 != ppxVar2) {
    uVar4 = (ulong)((long)ppxVar2 - (long)ppxVar1) >> 3;
    uVar5 = (undefined1)uVar4;
    uVar6 = (undefined1)(uVar4 >> 8);
    uVar7 = (undefined2)(uVar4 >> 0x10);
    (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffd4,4);
    write_00._12_1_ = uVar5;
    write_00._0_12_ = in_stack_ffffffffffffffc8;
    write_00._13_1_ = uVar6;
    write_00._14_2_ = uVar7;
    xr_writer::
    w_seq<std::vector<xray_re::xr_motion_marks*,std::allocator<xray_re::xr_motion_marks*>>,xray_re::xr_writer::f_w_const<xray_re::xr_motion_marks>>
              (w,&this->m_marks,write_00);
  }
  return;
}

Assistant:

void xr_skl_motion::save(xr_writer& w) const
{
	xr_motion::save(w);
	w.w_u16(m_marks.empty()? SMOTION_VERSION_6 : SMOTION_VERSION_7);
	w.w_u8(uint8_t(m_flags & 0xff));
	w.w_u16(m_bone_or_part);
	w.w_float(m_speed);
	w.w_float(m_accrue);
	w.w_float(m_falloff);
	w.w_float(m_power);
	w.w_size_u16(m_bone_motions.size());
	w.w_seq(m_bone_motions, xr_writer::f_w_const<xr_bone_motion>(&xr_bone_motion::save));
	
	// save marks
	if (!m_marks.empty()) {
		w.w_size_u32(m_marks.size());
		w.w_seq(m_marks, xr_writer::f_w_const<xr_motion_marks>(&xr_motion_marks::save));
	}
}